

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

Cache * leveldb::NewLRUCache(size_t capacity)

{
  ShardedLRUCache *this;
  size_t capacity_local;
  
  this = (ShardedLRUCache *)operator_new(0xdc0);
  anon_unknown_0::ShardedLRUCache::ShardedLRUCache(this,capacity);
  return &this->super_Cache;
}

Assistant:

Cache* NewLRUCache(size_t capacity) { return new ShardedLRUCache(capacity); }